

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

int __thiscall xercesc_4_0::TraverseSchema::init(TraverseSchema *this,EVP_PKEY_CTX *ctx)

{
  XMLScanner *pXVar1;
  MemoryManager *pMVar2;
  XMLSize_t XVar3;
  int iVar4;
  ValueVectorOf<unsigned_int> *pVVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ValueVectorOf<unsigned_int> **ppVVar6;
  undefined4 extraout_var_02;
  ValueVectorOf<xercesc_4_0::DOMNode_*> *pVVar7;
  undefined4 extraout_var_03;
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *pRVar8;
  undefined4 extraout_var_04;
  RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher> *pRVar9;
  undefined4 extraout_var_05;
  XSDLocator *this_00;
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *pVVar10;
  undefined4 extraout_var_06;
  void *pvVar11;
  XMLSize_t XVar12;
  uint i;
  long lVar13;
  undefined4 extraout_var_01;
  
  (this->fXSDErrorReporter).fErrorReporter = this->fErrorReporter;
  pXVar1 = this->fScanner;
  (this->fXSDErrorReporter).fExitOnFirstFatal = pXVar1->fExitOnFirstFatal;
  this->fFullConstraintChecking = pXVar1->fSchemaFullChecking;
  this->fDatatypeRegistry = &this->fSchemaGrammar->fDatatypeRegistry;
  this->fStringPool = this->fGrammarResolver->fStringPool;
  this->fEmptyNamespaceURI = pXVar1->fEmptyNamespaceId;
  pVVar5 = (ValueVectorOf<unsigned_int> *)XMemory::operator_new(0x28,this->fMemoryManager);
  pMVar2 = this->fMemoryManager;
  pVVar5->fCallDestructor = false;
  pVVar5->fCurCount = 0;
  pVVar5->fMaxCount = 8;
  pVVar5->fElemList = (uint *)0x0;
  pVVar5->fMemoryManager = pMVar2;
  iVar4 = (*pMVar2->_vptr_MemoryManager[3])();
  pVVar5->fElemList = (uint *)CONCAT44(extraout_var,iVar4);
  memset((uint *)CONCAT44(extraout_var,iVar4),0,pVVar5->fMaxCount << 2);
  this->fCurrentTypeNameStack = pVVar5;
  pVVar5 = (ValueVectorOf<unsigned_int> *)XMemory::operator_new(0x28,this->fMemoryManager);
  pMVar2 = this->fMemoryManager;
  pVVar5->fCallDestructor = false;
  pVVar5->fCurCount = 0;
  pVVar5->fMaxCount = 8;
  pVVar5->fElemList = (uint *)0x0;
  pVVar5->fMemoryManager = pMVar2;
  iVar4 = (*pMVar2->_vptr_MemoryManager[3])();
  pVVar5->fElemList = (uint *)CONCAT44(extraout_var_00,iVar4);
  memset((uint *)CONCAT44(extraout_var_00,iVar4),0,pVVar5->fMaxCount << 2);
  this->fCurrentGroupStack = pVVar5;
  iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,0x30);
  ppVVar6 = (ValueVectorOf<unsigned_int> **)CONCAT44(extraout_var_01,iVar4);
  this->fGlobalDeclarations = ppVVar6;
  *ppVVar6 = (ValueVectorOf<unsigned_int> *)0x0;
  ppVVar6[1] = (ValueVectorOf<unsigned_int> *)0x0;
  ppVVar6[2] = (ValueVectorOf<unsigned_int> *)0x0;
  ppVVar6[3] = (ValueVectorOf<unsigned_int> *)0x0;
  ppVVar6[4] = (ValueVectorOf<unsigned_int> *)0x0;
  ppVVar6[5] = (ValueVectorOf<unsigned_int> *)0x0;
  lVar13 = 0;
  do {
    pVVar5 = (ValueVectorOf<unsigned_int> *)XMemory::operator_new(0x28,this->fMemoryManager);
    pMVar2 = this->fMemoryManager;
    pVVar5->fCallDestructor = false;
    pVVar5->fCurCount = 0;
    pVVar5->fMaxCount = 8;
    pVVar5->fElemList = (uint *)0x0;
    pVVar5->fMemoryManager = pMVar2;
    iVar4 = (*pMVar2->_vptr_MemoryManager[3])();
    pVVar5->fElemList = (uint *)CONCAT44(extraout_var_02,iVar4);
    memset((uint *)CONCAT44(extraout_var_02,iVar4),0,pVVar5->fMaxCount << 2);
    this->fGlobalDeclarations[lVar13] = pVVar5;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 6);
  pVVar7 = (ValueVectorOf<xercesc_4_0::DOMNode_*> *)XMemory::operator_new(0x28,this->fMemoryManager)
  ;
  pMVar2 = this->fMemoryManager;
  pVVar7->fCallDestructor = false;
  pVVar7->fCurCount = 0;
  pVVar7->fMaxCount = 4;
  pVVar7->fElemList = (DOMNode **)0x0;
  pVVar7->fMemoryManager = pMVar2;
  iVar4 = (*pMVar2->_vptr_MemoryManager[3])();
  pVVar7->fElemList = (DOMNode **)CONCAT44(extraout_var_03,iVar4);
  memset((DOMNode **)CONCAT44(extraout_var_03,iVar4),0,pVVar7->fMaxCount << 3);
  this->fNonXSAttList = pVVar7;
  pRVar8 = (RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x30,this->fMemoryManager);
  pMVar2 = this->fMemoryManager;
  pRVar8->fMemoryManager = pMVar2;
  pRVar8->fAdoptedElems = false;
  pRVar8->fBucketList = (RefHash2KeysTableBucketElem<char16_t> **)0x0;
  pRVar8->fHashModulus = 0xd;
  pRVar8->fCount = 0;
  iVar4 = (*pMVar2->_vptr_MemoryManager[3])();
  pRVar8->fBucketList = (RefHash2KeysTableBucketElem<char16_t> **)CONCAT44(extraout_var_04,iVar4);
  memset((RefHash2KeysTableBucketElem<char16_t> **)CONCAT44(extraout_var_04,iVar4),0,
         pRVar8->fHashModulus << 3);
  this->fNotationRegistry = pRVar8;
  pRVar9 = (RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher> *)
           XMemory::operator_new(0x38,this->fMemoryManager);
  pMVar2 = this->fMemoryManager;
  pRVar9->fMemoryManager = pMVar2;
  pRVar9->fAdoptedElems = false;
  pRVar9->fBucketList = (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> **)0x0;
  pRVar9->fHashModulus = 0x1d;
  pRVar9->fInitialModulus = 0x1d;
  pRVar9->fCount = 0;
  iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,0xe8);
  pRVar9->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> **)CONCAT44(extraout_var_05,iVar4);
  XVar3 = pRVar9->fHashModulus;
  if (XVar3 != 0) {
    XVar12 = 0;
    do {
      pRVar9->fBucketList[XVar12] = (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0;
      XVar12 = XVar12 + 1;
    } while (XVar3 != XVar12);
  }
  this->fPreprocessedNodes = pRVar9;
  this_00 = (XSDLocator *)XMemory::operator_new(0x28,this->fMemoryManager);
  XSDLocator::XSDLocator(this_00);
  this->fLocator = this_00;
  pVVar10 = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)
            XMemory::operator_new(0x28,this->fMemoryManager);
  pMVar2 = this->fMemoryManager;
  pVVar10->fCallDestructor = false;
  pVVar10->fCurCount = 0;
  pVVar10->fMaxCount = 0x10;
  pVVar10->fElemList = (DOMElement **)0x0;
  pVVar10->fMemoryManager = pMVar2;
  iVar4 = (*pMVar2->_vptr_MemoryManager[3])();
  pVVar10->fElemList = (DOMElement **)CONCAT44(extraout_var_06,iVar4);
  pvVar11 = memset((DOMElement **)CONCAT44(extraout_var_06,iVar4),0,pVVar10->fMaxCount << 3);
  this->fDeclStack = pVVar10;
  return (int)pvVar11;
}

Assistant:

void TraverseSchema::init() {

    fXSDErrorReporter.setErrorReporter(fErrorReporter);
    fXSDErrorReporter.setExitOnFirstFatal(fScanner->getExitOnFirstFatal());

    fFullConstraintChecking = fScanner->getValidationSchemaFullChecking();

    fDatatypeRegistry = fSchemaGrammar->getDatatypeRegistry();
    fStringPool = fGrammarResolver->getStringPool();
    fEmptyNamespaceURI = fScanner->getEmptyNamespaceId();
    fCurrentTypeNameStack = new (fMemoryManager) ValueVectorOf<unsigned int>(8, fMemoryManager);
    fCurrentGroupStack = new (fMemoryManager) ValueVectorOf<unsigned int>(8, fMemoryManager);

    fGlobalDeclarations = (ValueVectorOf<unsigned int>**) fMemoryManager->allocate
    (
        ENUM_ELT_SIZE * sizeof(ValueVectorOf<unsigned int>*)
    );//new ValueVectorOf<unsigned int>*[ENUM_ELT_SIZE];
    memset(fGlobalDeclarations, 0, ENUM_ELT_SIZE * sizeof(ValueVectorOf<unsigned int>*));
    for(unsigned int i=0; i < ENUM_ELT_SIZE; i++)
        fGlobalDeclarations[i] = new (fMemoryManager) ValueVectorOf<unsigned int>(8, fMemoryManager);

    fNonXSAttList = new (fMemoryManager) ValueVectorOf<DOMNode*>(4, fMemoryManager);
    fNotationRegistry = new (fMemoryManager) RefHash2KeysTableOf<XMLCh>(13, (bool) false, fMemoryManager);
    fPreprocessedNodes = new (fMemoryManager) RefHashTableOf<SchemaInfo, PtrHasher>
    (
        29
        , false
        , fMemoryManager
    );
    fLocator = new (fMemoryManager) XSDLocator();
    fDeclStack = new (fMemoryManager) ValueVectorOf<const DOMElement*>(16, fMemoryManager);
}